

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  int iVar1;
  U32 *rankStats;
  undefined8 *puVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  char cVar11;
  char cVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  size_t sVar16;
  byte bVar17;
  uint uVar18;
  U32 current_1;
  uint *puVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  size_t sVar31;
  size_t sVar32;
  uint uVar33;
  U32 *rankVal0;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  U32 nbSymbols;
  U32 tableLog;
  U32 rankVal [13];
  uint local_f8;
  uint local_f4 [19];
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined4 uStack_98;
  undefined4 local_94;
  undefined8 uStack_90;
  undefined1 auStack_88 [20];
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined4 uStack_58;
  undefined4 local_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  undefined8 uStack_3c;
  
  sVar31 = 0xffffffffffffffd4;
  sVar32 = sVar31;
  if (0x5db < wkspSize) {
    uVar6 = *DTable;
    uVar20 = uVar6 & 0xff;
    rankStats = (U32 *)((long)workSpace + 0x270);
    *(undefined8 *)((long)workSpace + 700) = 0;
    *(undefined8 *)((long)workSpace + 0x2c4) = 0;
    *(undefined8 *)((long)workSpace + 0x2cc) = 0;
    *(undefined8 *)((long)workSpace + 0x2d4) = 0;
    *(undefined8 *)((long)workSpace + 0x2b0) = 0;
    *(undefined8 *)((long)workSpace + 0x2b8) = 0;
    *(undefined8 *)((long)workSpace + 0x2c0) = 0;
    *(undefined8 *)((long)workSpace + 0x2c8) = 0;
    *(undefined8 *)((long)workSpace + 0x290) = 0;
    *(undefined8 *)((long)workSpace + 0x298) = 0;
    *(undefined8 *)((long)workSpace + 0x2a0) = 0;
    *(undefined8 *)((long)workSpace + 0x2a8) = 0;
    rankStats[0] = 0;
    rankStats[1] = 0;
    *(undefined8 *)((long)workSpace + 0x278) = 0;
    *(undefined8 *)((long)workSpace + 0x280) = 0;
    *(undefined8 *)((long)workSpace + 0x288) = 0;
    if (uVar20 < 0xd) {
      auVar35 = ZEXT1632(in_ZMM3._0_16_);
      sVar16 = HUF_readStats((BYTE *)((long)workSpace + 0x4dc),0x100,rankStats,&local_f8,local_f4,
                             src,srcSize);
      sVar32 = sVar16;
      if (sVar16 < 0xffffffffffffff89) {
        cVar12 = (char)uVar6;
        sVar32 = sVar31;
        if (local_f4[0] <= uVar20) {
          iVar1 = local_f4[0] + 1;
          uVar29 = 0;
          uVar13 = local_f4[0];
          do {
            uVar25 = (ulong)uVar13;
            uVar13 = uVar13 - 1;
            uVar29 = uVar29 + 1;
          } while (rankStats[uVar25] == 0);
          uVar18 = (local_f4[0] - uVar29) + 2;
          uVar33 = 0;
          if (uVar13 < 0xfffffffe) {
            lVar23 = 0;
            uVar21 = 0;
            do {
              uVar33 = *(int *)((long)workSpace + lVar23 * 4 + 0x274) + uVar21;
              *(uint *)((long)workSpace + lVar23 * 4 + 0x2ac) = uVar21;
              lVar23 = lVar23 + 1;
              uVar21 = uVar33;
            } while ((ulong)uVar18 - 1 != lVar23);
          }
          *(uint *)((long)workSpace + 0x2a8) = uVar33;
          if ((ulong)local_f8 != 0) {
            uVar25 = 0;
            do {
              bVar3 = *(byte *)((long)workSpace + uVar25 + 0x4dc);
              uVar21 = *(uint *)((long)workSpace + (ulong)bVar3 * 4 + 0x2a8);
              *(uint *)((long)workSpace + (ulong)bVar3 * 4 + 0x2a8) = uVar21 + 1;
              *(char *)((long)workSpace + (ulong)uVar21 * 2 + 0x2dc) = (char)uVar25;
              *(byte *)((long)workSpace + (ulong)uVar21 * 2 + 0x2dd) = bVar3;
              uVar25 = uVar25 + 1;
            } while (local_f8 != uVar25);
          }
          uVar21 = (uVar20 - uVar29) + 1;
          *(undefined4 *)((long)workSpace + 0x2a8) = 0;
          if (uVar13 < 0xfffffffe) {
            lVar23 = 0;
            iVar14 = 0;
            do {
              lVar28 = lVar23 * 4;
              cVar11 = (char)lVar23;
              *(int *)((long)workSpace + lVar23 * 4 + 4) = iVar14;
              lVar23 = lVar23 + 1;
              iVar14 = (*(int *)((long)workSpace + lVar28 + 0x274) <<
                       ((cVar12 - (char)local_f4[0]) + cVar11 & 0x1fU)) + iVar14;
            } while ((ulong)uVar18 - 1 != lVar23);
          }
          if (uVar29 < uVar21) {
            uVar25 = (ulong)uVar29;
            lVar23 = uVar25 * 0x34;
            do {
              puVar19 = (uint *)((long)workSpace + 4);
              lVar28 = (ulong)uVar18 - 1;
              if (uVar13 < 0xfffffffe) {
                do {
                  *(uint *)((long)puVar19 + lVar23) = *puVar19 >> ((byte)uVar25 & 0x1f);
                  lVar28 = lVar28 + -1;
                  puVar19 = puVar19 + 1;
                } while (lVar28 != 0);
              }
              uVar25 = uVar25 + 1;
              lVar23 = lVar23 + 0x34;
            } while (uVar21 != (uint)uVar25);
          }
          uStack_48 = (undefined4)((ulong)*(undefined8 *)((long)workSpace + 0x1c) >> 0x20);
          uStack_44 = *(undefined8 *)((long)workSpace + 0x24);
          uStack_3c = *(undefined8 *)((long)workSpace + 0x2c);
          uStack_68 = *workSpace;
          uStack_60 = *(undefined8 *)((long)workSpace + 8);
          uStack_58 = (undefined4)*(undefined8 *)((long)workSpace + 0x10);
          local_54 = (undefined4)((ulong)*(undefined8 *)((long)workSpace + 0x10) >> 0x20);
          uStack_50 = (undefined4)*(undefined8 *)((long)workSpace + 0x18);
          uStack_4c = (undefined4)((ulong)*(undefined8 *)((long)workSpace + 0x18) >> 0x20);
          if (uVar33 != 0) {
            uVar25 = 0;
            auVar9 = vpmovsxbq_avx2(ZEXT416(0x3020100));
            auVar10 = vpmovsxbq_avx2(ZEXT416(0x7060504));
            auVar34._8_8_ = 0x8000000000000000;
            auVar34._0_8_ = 0x8000000000000000;
            auVar34._16_8_ = 0x8000000000000000;
            auVar34._24_8_ = 0x8000000000000000;
            auVar35 = vpcmpeqd_avx2(auVar35,auVar35);
            do {
              uVar21 = (uint)*(byte *)((long)workSpace + uVar25 * 2 + 0x2dc);
              bVar3 = *(byte *)((long)workSpace + uVar25 * 2 + 0x2dd);
              uVar18 = iVar1 - (uint)bVar3;
              uVar13 = *(uint *)((long)&uStack_68 + (ulong)bVar3 * 4);
              uVar30 = (ulong)uVar13;
              bVar17 = (byte)(uVar20 - uVar18);
              iVar14 = 1 << (bVar17 & 0x1f);
              if (uVar20 - uVar18 < uVar29) {
                uVar15 = iVar14 + uVar13;
                if (uVar13 < uVar15) {
                  lVar23 = uVar15 - uVar30;
                  iVar22 = (uVar18 & 0xff) * 0x10000 + uVar21 + 0x1000000;
                  lVar28 = lVar23 + -1;
                  auVar37._8_8_ = lVar28;
                  auVar37._0_8_ = lVar28;
                  auVar37._16_8_ = lVar28;
                  auVar37._24_8_ = lVar28;
                  auVar36._4_4_ = iVar22;
                  auVar36._0_4_ = iVar22;
                  auVar36._8_4_ = iVar22;
                  auVar36._12_4_ = iVar22;
                  auVar36._16_4_ = iVar22;
                  auVar36._20_4_ = iVar22;
                  auVar36._24_4_ = iVar22;
                  auVar36._28_4_ = iVar22;
                  uVar24 = 0;
                  do {
                    auVar39._8_8_ = uVar24;
                    auVar39._0_8_ = uVar24;
                    auVar39._16_8_ = uVar24;
                    auVar39._24_8_ = uVar24;
                    auVar38 = vpor_avx2(auVar39,auVar9);
                    auVar40 = vpor_avx2(auVar39,auVar10);
                    auVar40 = vpcmpgtq_avx2(auVar40 ^ auVar34,auVar37 ^ auVar34);
                    auVar38 = vpcmpgtq_avx2(auVar38 ^ auVar34,auVar37 ^ auVar34);
                    auVar40 = vpackssdw_avx2(auVar38,auVar40);
                    auVar8 = vpackssdw_avx(SUB3216(auVar40 ^ auVar35,0),
                                           SUB3216(auVar40 ^ auVar35,0x10));
                    auVar8 = vpshufd_avx(auVar8,0xd8);
                    auVar40 = vpmovzxwd_avx2(auVar8);
                    auVar40 = vpslld_avx2(auVar40,0x1f);
                    auVar40 = vpmaskmovd_avx2(auVar40,auVar36);
                    *(undefined1 (*) [32])(DTable + uVar30 + uVar24 + 1) = auVar40;
                    uVar24 = uVar24 + 8;
                  } while ((lVar23 + 7U & 0xfffffffffffffff8) != uVar24);
                }
              }
              else {
                uVar15 = uVar18 + (iVar1 - uVar20);
                uVar24 = 1;
                if (1 < (int)uVar15) {
                  uVar24 = (ulong)uVar15;
                }
                uVar7 = *(uint *)((long)workSpace + uVar24 * 4 + 0x2a4);
                puVar2 = (undefined8 *)((long)workSpace + (ulong)uVar18 * 0x34);
                auStack_88 = SUB3220(*(undefined1 (*) [32])
                                      ((long)workSpace + (ulong)uVar18 * 0x34 + 0x14),0xc);
                uStack_a8 = *puVar2;
                uStack_a0 = puVar2[1];
                uStack_98 = (undefined4)puVar2[2];
                local_94 = (undefined4)((ulong)puVar2[2] >> 0x20);
                uStack_90 = puVar2[3];
                if ((1 < (int)uVar15) &&
                   (uVar24 = (ulong)*(uint *)((long)&uStack_a8 + uVar24 * 4), uVar24 != 0)) {
                  iVar22 = (uVar18 & 0xff) * 0x10000 + uVar21 + 0x1000000;
                  lVar23 = uVar24 - 1;
                  auVar38._8_8_ = lVar23;
                  auVar38._0_8_ = lVar23;
                  auVar38._16_8_ = lVar23;
                  auVar38._24_8_ = lVar23;
                  auVar40._4_4_ = iVar22;
                  auVar40._0_4_ = iVar22;
                  auVar40._8_4_ = iVar22;
                  auVar40._12_4_ = iVar22;
                  auVar40._16_4_ = iVar22;
                  auVar40._20_4_ = iVar22;
                  auVar40._24_4_ = iVar22;
                  auVar40._28_4_ = iVar22;
                  uVar26 = 0;
                  do {
                    auVar41._8_8_ = uVar26;
                    auVar41._0_8_ = uVar26;
                    auVar41._16_8_ = uVar26;
                    auVar41._24_8_ = uVar26;
                    auVar36 = vpor_avx2(auVar41,auVar9);
                    auVar41 = vpor_avx2(auVar41,auVar10);
                    auVar41 = vpcmpgtq_avx2(auVar41 ^ auVar34,auVar38 ^ auVar34);
                    auVar36 = vpcmpgtq_avx2(auVar36 ^ auVar34,auVar38 ^ auVar34);
                    auVar41 = vpackssdw_avx2(auVar36,auVar41);
                    auVar8 = vpackssdw_avx(SUB3216(auVar41 ^ auVar35,0),
                                           SUB3216(auVar41 ^ auVar35,0x10));
                    auVar8 = vpshufd_avx(auVar8,0xd8);
                    auVar41 = vpmovzxwd_avx2(auVar8);
                    auVar41 = vpslld_avx2(auVar41,0x1f);
                    auVar41 = vpmaskmovd_avx2(auVar41,auVar40);
                    *(undefined1 (*) [32])(DTable + uVar30 + uVar26 + 1) = auVar41;
                    uVar26 = uVar26 + 8;
                  } while ((uVar24 + 7 & 0xfffffffffffffff8) != uVar26);
                }
                if (uVar33 != uVar7) {
                  uVar24 = 0;
                  do {
                    bVar4 = *(byte *)((long)workSpace + uVar24 * 2 + (ulong)uVar7 * 2 + 0x2dc);
                    bVar5 = *(byte *)((long)workSpace + uVar24 * 2 + (ulong)uVar7 * 2 + 0x2dd);
                    uVar15 = *(uint *)((long)&uStack_a8 + (ulong)bVar5 * 4);
                    uVar27 = (1 << (bVar17 - (char)(iVar1 - (uint)bVar5) & 0x1f)) + uVar15;
                    do {
                      uVar26 = (ulong)uVar15;
                      uVar15 = uVar15 + 1;
                      DTable[uVar30 + uVar26 + 1] =
                           uVar21 + (((iVar1 - (uint)bVar5) + uVar18 & 0xff) << 0x10 |
                                    (uint)bVar4 << 8) + 0x2000000;
                    } while (uVar15 < uVar27);
                    *(uint *)((long)&uStack_a8 + (ulong)bVar5 * 4) = uVar27;
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != uVar33 - uVar7);
                }
              }
              *(uint *)((long)&uStack_68 + (ulong)bVar3 * 4) = iVar14 + uVar13;
              uVar25 = uVar25 + 1;
            } while (uVar25 != uVar33);
          }
          *(char *)DTable = cVar12;
          *(undefined1 *)((long)DTable + 1) = 1;
          *(char *)((long)DTable + 2) = cVar12;
          *(char *)((long)DTable + 3) = (char)(uVar6 >> 0x18);
          sVar32 = sVar16;
        }
      }
    }
  }
  return sVar32;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable,
                       const void* src, size_t srcSize,
                             void* workSpace, size_t wkspSize)
{
    U32 tableLog, maxW, sizeOfSort, nbSymbols;
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    U32 const maxTableLog = dtd.maxTableLog;
    size_t iSize;
    void* dtPtr = DTable+1;   /* force compiler to avoid strict-aliasing */
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;
    U32 *rankStart;

    rankValCol_t* rankVal;
    U32* rankStats;
    U32* rankStart0;
    sortedSymbol_t* sortedSymbol;
    BYTE* weightList;
    size_t spaceUsed32 = 0;

    rankVal = (rankValCol_t *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += (sizeof(rankValCol_t) * HUF_TABLELOG_MAX) >> 2;
    rankStats = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_MAX + 1;
    rankStart0 = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_MAX + 2;
    sortedSymbol = (sortedSymbol_t *)workSpace + (spaceUsed32 * sizeof(U32)) / sizeof(sortedSymbol_t);
    spaceUsed32 += HUF_ALIGN(sizeof(sortedSymbol_t) * (HUF_SYMBOLVALUE_MAX + 1), sizeof(U32)) >> 2;
    weightList = (BYTE *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += HUF_ALIGN(HUF_SYMBOLVALUE_MAX + 1, sizeof(U32)) >> 2;

    if ((spaceUsed32 << 2) > wkspSize) return ERROR(tableLog_tooLarge);

    rankStart = rankStart0 + 1;
    memset(rankStats, 0, sizeof(U32) * (2 * HUF_TABLELOG_MAX + 2 + 1));

    DEBUG_STATIC_ASSERT(sizeof(HUF_DEltX2) == sizeof(HUF_DTable));   /* if compiler fails here, assertion is wrong */
    if (maxTableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    /* memset(weightList, 0, sizeof(weightList)); */  /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats(weightList, HUF_SYMBOLVALUE_MAX + 1, rankStats, &nbSymbols, &tableLog, src, srcSize);
    if (HUF_isError(iSize)) return iSize;

    /* check result */
    if (tableLog > maxTableLog) return ERROR(tableLog_tooLarge);   /* DTable can't fit code depth */

    /* find maxWeight */
    for (maxW = tableLog; rankStats[maxW]==0; maxW--) {}  /* necessarily finds a solution before 0 */

    /* Get start index of each weight */
    {   U32 w, nextRankStart = 0;
        for (w=1; w<maxW+1; w++) {
            U32 current = nextRankStart;
            nextRankStart += rankStats[w];
            rankStart[w] = current;
        }
        rankStart[0] = nextRankStart;   /* put all 0w symbols at the end of sorted list*/
        sizeOfSort = nextRankStart;
    }

    /* sort symbols by weight */
    {   U32 s;
        for (s=0; s<nbSymbols; s++) {
            U32 const w = weightList[s];
            U32 const r = rankStart[w]++;
            sortedSymbol[r].symbol = (BYTE)s;
            sortedSymbol[r].weight = (BYTE)w;
        }
        rankStart[0] = 0;   /* forget 0w symbols; this is beginning of weight(1) */
    }

    /* Build rankVal */
    {   U32* const rankVal0 = rankVal[0];
        {   int const rescale = (maxTableLog-tableLog) - 1;   /* tableLog <= maxTableLog */
            U32 nextRankVal = 0;
            U32 w;
            for (w=1; w<maxW+1; w++) {
                U32 current = nextRankVal;
                nextRankVal += rankStats[w] << (w+rescale);
                rankVal0[w] = current;
        }   }
        {   U32 const minBits = tableLog+1 - maxW;
            U32 consumed;
            for (consumed = minBits; consumed < maxTableLog - minBits + 1; consumed++) {
                U32* const rankValPtr = rankVal[consumed];
                U32 w;
                for (w = 1; w < maxW+1; w++) {
                    rankValPtr[w] = rankVal0[w] >> consumed;
    }   }   }   }

    HUF_fillDTableX2(dt, maxTableLog,
                   sortedSymbol, sizeOfSort,
                   rankStart0, rankVal, maxW,
                   tableLog+1);

    dtd.tableLog = (BYTE)maxTableLog;
    dtd.tableType = 1;
    memcpy(DTable, &dtd, sizeof(dtd));
    return iSize;
}